

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

MessageAnalysis __thiscall
google::protobuf::compiler::cpp::SCCAnalyzer::GetSCCAnalysis(SCCAnalyzer *this,SCC *scc)

{
  _Rb_tree_header *p_Var1;
  Descriptor *pDVar2;
  long lVar3;
  SCCAnalyzer *this_00;
  Type TVar4;
  MessageAnalysis MVar5;
  MessageAnalysis *pMVar6;
  pointer ppDVar7;
  Descriptor *descriptor;
  SCC *scc_00;
  _Base_ptr p_Var8;
  bool bVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  bool bVar12;
  long lVar13;
  bool bVar14;
  long lVar15;
  bool local_58;
  SCC *local_50;
  map<const_google::protobuf::compiler::cpp::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::cpp::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::cpp::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
  *local_48;
  ulong local_40;
  SCCAnalyzer *local_38;
  
  p_Var1 = &(this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = (this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var8 = &p_Var1->_M_header;
  for (; p_Var10 != (_Base_ptr)0x0; p_Var10 = (&p_Var10->_M_left)[*(SCC **)(p_Var10 + 1) < scc]) {
    if (*(SCC **)(p_Var10 + 1) >= scc) {
      p_Var8 = p_Var10;
    }
  }
  p_Var10 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var8 != p_Var1) && (p_Var10 = p_Var8, scc < *(SCC **)(p_Var8 + 1))) {
    p_Var10 = &p_Var1->_M_header;
  }
  local_48 = &this->analysis_cache_;
  local_50 = scc;
  if ((_Rb_tree_header *)p_Var10 == p_Var1) {
    ppDVar7 = (scc->descriptors).
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((scc->descriptors).
        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish == ppDVar7) {
      bVar14 = false;
      bVar12 = false;
      bVar9 = false;
      local_58 = false;
    }
    else {
      uVar11 = 0;
      local_58 = false;
      bVar9 = false;
      bVar12 = false;
      bVar14 = false;
      local_38 = this;
      do {
        pDVar2 = ppDVar7[uVar11];
        if (0 < *(int *)(pDVar2 + 0x68)) {
          bVar12 = true;
        }
        local_40 = uVar11;
        if (0 < *(int *)(pDVar2 + 0x2c)) {
          lVar13 = 0;
          lVar15 = 0;
          do {
            lVar3 = *(long *)(pDVar2 + 0x30);
            if (*(int *)(lVar3 + 0x4c + lVar13) == 2) {
              bVar14 = true;
            }
            TVar4 = FieldDescriptor::type((FieldDescriptor *)(lVar3 + lVar13));
            if (TVar4 - TYPE_GROUP < 2) {
              descriptor = FieldDescriptor::message_type((FieldDescriptor *)(lVar3 + lVar13));
              this_00 = local_38;
              scc_00 = GetSCC(local_38,descriptor);
              if (scc_00 == local_50) {
                local_58 = true;
              }
              else {
                MVar5 = GetSCCAnalysis(this_00,scc_00);
                bVar9 = (bool)(bVar9 | MVar5.contains_cord & 1U);
                bVar12 = (bool)(bVar12 | MVar5.contains_extension & 1U);
                bVar14 = (bool)(bVar14 | MVar5.contains_required & 1U);
              }
            }
            else if (((TVar4 == TYPE_BYTES) || (TVar4 == TYPE_STRING)) &&
                    (*(int *)(*(long *)(lVar3 + 0x80 + lVar13) + 0x68) == 1)) {
              bVar9 = true;
            }
            lVar15 = lVar15 + 1;
            lVar13 = lVar13 + 0xa8;
          } while (lVar15 < *(int *)(pDVar2 + 0x2c));
        }
        uVar11 = local_40 + 1;
        ppDVar7 = (local_50->descriptors).
                  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar11 < (ulong)((long)(local_50->descriptors).
                                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar7 >>
                               3));
    }
    pMVar6 = std::
             map<const_google::protobuf::compiler::cpp::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::cpp::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::cpp::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
             ::operator[](local_48,&local_50);
    pMVar6->is_recursive = local_58;
    pMVar6->contains_cord = bVar9;
    pMVar6->contains_extension = bVar12;
    pMVar6->contains_required = bVar14;
  }
  else {
    pMVar6 = std::
             map<const_google::protobuf::compiler::cpp::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::cpp::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::cpp::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
             ::operator[](local_48,&local_50);
  }
  return *pMVar6;
}

Assistant:

MessageAnalysis SCCAnalyzer::GetSCCAnalysis(const SCC* scc) {
  if (analysis_cache_.count(scc)) return analysis_cache_[scc];
  MessageAnalysis result = MessageAnalysis();
  for (int i = 0; i < scc->descriptors.size(); i++) {
    const Descriptor* descriptor = scc->descriptors[i];
    if (descriptor->extension_range_count() > 0) {
      result.contains_extension = true;
    }
    for (int i = 0; i < descriptor->field_count(); i++) {
      const FieldDescriptor* field = descriptor->field(i);
      if (field->is_required()) {
        result.contains_required = true;
      }
      switch (field->type()) {
        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_BYTES: {
          if (field->options().ctype() == FieldOptions::CORD) {
            result.contains_cord = true;
          }
          break;
        }
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE: {
          const SCC* child = GetSCC(field->message_type());
          if (child != scc) {
            MessageAnalysis analysis = GetSCCAnalysis(child);
            result.contains_cord |= analysis.contains_cord;
            result.contains_extension |= analysis.contains_extension;
            if (!ShouldIgnoreRequiredFieldCheck(field, options_)) {
              result.contains_required |= analysis.contains_required;
            }
          } else {
            // This field points back into the same SCC hence the messages
            // in the SCC are recursive. Note if SCC contains more than two
            // nodes it has to be recursive, however this test also works for
            // a single node that is recursive.
            result.is_recursive = true;
          }
          break;
        }
        default:
          break;
      }
    }
  }
  // We deliberately only insert the result here. After we contracted the SCC
  // in the graph, the graph should be a DAG. Hence we shouldn't need to mark
  // nodes visited as we can never return to them. By inserting them here
  // we will go in an infinite loop if the SCC is not correct.
  return analysis_cache_[scc] = result;
}